

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsPublicationPublishComplex(HelicsPublication pub,double real,double imag,HelicsError *err)

{
  PublicationObject *pPVar1;
  undefined8 extraout_RDX;
  complex<double> val;
  
  pPVar1 = anon_unknown.dwarf_694c0::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    val._M_value._8_8_ = extraout_RDX;
    val._M_value._0_8_ = err;
    helics::Publication::publish(pPVar1->pubPtr,val);
  }
  return;
}

Assistant:

void helicsPublicationPublishComplex(HelicsPublication pub, double real, double imag, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(std::complex<double>(real, imag));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}